

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpComms.cpp
# Opt level: O0

void __thiscall helics::udp::UdpComms::~UdpComms(UdpComms *this)

{
  NetworkCommsInterface *in_RDI;
  promise<int> *unaff_retaddr;
  CommsInterface *in_stack_00000040;
  
  CommsInterface::disconnect(in_stack_00000040);
  std::future<int>::~future((future<int> *)0x471e4b);
  std::promise<int>::~promise(unaff_retaddr);
  NetworkCommsInterface::~NetworkCommsInterface(in_RDI);
  return;
}

Assistant:

UdpComms::~UdpComms()
{
    disconnect();
}